

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O0

void crnlib::WriteEndMarker(CLzmaEnc *p,UInt32 posState)

{
  UInt32 len;
  UInt32 posState_local;
  CLzmaEnc *p_local;
  
  RangeEnc_EncodeBit(&p->rc,p->isMatch[p->state] + posState,1);
  RangeEnc_EncodeBit(&p->rc,p->isRep + p->state,0);
  p->state = *(UInt32 *)(kMatchNextStates + (ulong)p->state * 4);
  LenEnc_Encode2(&p->lenEnc,&p->rc,0,posState,(uint)((p->fastMode != 0 ^ 0xffU) & 1),p->ProbPrices);
  RcTree_Encode(&p->rc,p->posSlotEncoder[0],6,0x3f);
  RangeEnc_EncodeDirectBits(&p->rc,0x3ffffff,0x1a);
  RcTree_ReverseEncode(&p->rc,p->posAlignEncoder,4,0xf);
  return;
}

Assistant:

static void WriteEndMarker(CLzmaEnc* p, UInt32 posState) {
  UInt32 len;
  RangeEnc_EncodeBit(&p->rc, &p->isMatch[p->state][posState], 1);
  RangeEnc_EncodeBit(&p->rc, &p->isRep[p->state], 0);
  p->state = kMatchNextStates[p->state];
  len = LZMA_MATCH_LEN_MIN;
  LenEnc_Encode2(&p->lenEnc, &p->rc, len - LZMA_MATCH_LEN_MIN, posState, !p->fastMode, p->ProbPrices);
  RcTree_Encode(&p->rc, p->posSlotEncoder[GetLenToPosState(len)], kNumPosSlotBits, (1 << kNumPosSlotBits) - 1);
  RangeEnc_EncodeDirectBits(&p->rc, (((UInt32)1 << 30) - 1) >> kNumAlignBits, 30 - kNumAlignBits);
  RcTree_ReverseEncode(&p->rc, p->posAlignEncoder, kNumAlignBits, kAlignMask);
}